

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_hist.c
# Opt level: O0

void update_rate_histogram(rate_hist *hist,aom_codec_enc_cfg_t *cfg,aom_codec_cx_pkt_t *pkt)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int i_idx;
  int idx;
  int64_t now;
  int64_t sum_sz;
  int64_t avg_bitrate;
  int64_t then;
  int i;
  aom_codec_cx_pkt_t *pkt_local;
  aom_codec_enc_cfg_t *cfg_local;
  rate_hist *hist_local;
  
  sum_sz = 0;
  uVar2 = (ulong)((pkt->data).frame.pts * 1000 * (long)(cfg->g_timebase).num) /
          (ulong)(long)(cfg->g_timebase).den;
  if (((hist != (rate_hist *)0x0) && (cfg != (aom_codec_enc_cfg_t *)0x0)) &&
     (pkt != (aom_codec_cx_pkt_t *)0x0)) {
    iVar4 = hist->frames;
    hist->frames = iVar4 + 1;
    iVar4 = iVar4 % hist->samples;
    hist->pts[iVar4] = uVar2;
    hist->sz[iVar4] = (int)(pkt->data).frame.sz;
    if (((long)(ulong)cfg->rc_buf_initial_sz <= (long)uVar2) && (cfg->rc_target_bitrate != 0)) {
      i = hist->frames;
      then = uVar2;
      while( true ) {
        bVar1 = false;
        if (0 < i) {
          bVar1 = hist->frames - i < hist->samples;
        }
        if (!bVar1) break;
        iVar4 = (i + -1) % hist->samples;
        then = hist->pts[iVar4];
        if ((long)(ulong)cfg->rc_buf_sz < (long)(uVar2 - then)) break;
        sum_sz = hist->sz[iVar4] + sum_sz;
        i = i + -1;
      }
      if (uVar2 != then) {
        lVar3 = (sum_sz * 8000) / (long)(uVar2 - then);
        idx = (int)((lVar3 * 0x32) / (long)(ulong)(cfg->rc_target_bitrate * 1000));
        if (idx < 0) {
          idx = 0;
        }
        if (99 < idx) {
          idx = 99;
        }
        if (lVar3 < hist->bucket[idx].low) {
          hist->bucket[idx].low = (int)lVar3;
        }
        if (hist->bucket[idx].high < lVar3) {
          hist->bucket[idx].high = (int)lVar3;
        }
        hist->bucket[idx].count = hist->bucket[idx].count + 1;
        hist->total = hist->total + 1;
      }
    }
  }
  return;
}

Assistant:

void update_rate_histogram(struct rate_hist *hist,
                           const aom_codec_enc_cfg_t *cfg,
                           const aom_codec_cx_pkt_t *pkt) {
  int i;
  int64_t then = 0;
  int64_t avg_bitrate = 0;
  int64_t sum_sz = 0;
  const int64_t now = pkt->data.frame.pts * 1000 *
                      (uint64_t)cfg->g_timebase.num /
                      (uint64_t)cfg->g_timebase.den;

  int idx;

  if (hist == NULL || cfg == NULL || pkt == NULL) return;

  idx = hist->frames++ % hist->samples;
  hist->pts[idx] = now;
  hist->sz[idx] = (int)pkt->data.frame.sz;

  if (now < cfg->rc_buf_initial_sz) return;

  if (!cfg->rc_target_bitrate) return;

  then = now;

  /* Sum the size over the past rc_buf_sz ms */
  for (i = hist->frames; i > 0 && hist->frames - i < hist->samples; i--) {
    const int i_idx = (i - 1) % hist->samples;

    then = hist->pts[i_idx];
    if (now - then > cfg->rc_buf_sz) break;
    sum_sz += hist->sz[i_idx];
  }

  if (now == then) return;

  avg_bitrate = sum_sz * 8 * 1000 / (now - then);
  idx = (int)(avg_bitrate * (RATE_BINS / 2) / (cfg->rc_target_bitrate * 1000));
  if (idx < 0) idx = 0;
  if (idx > RATE_BINS - 1) idx = RATE_BINS - 1;
  if (hist->bucket[idx].low > avg_bitrate)
    hist->bucket[idx].low = (int)avg_bitrate;
  if (hist->bucket[idx].high < avg_bitrate)
    hist->bucket[idx].high = (int)avg_bitrate;
  hist->bucket[idx].count++;
  hist->total++;
}